

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O1

int uv_cpu_info(uv_cpu_info_t **cpu_infos,int *count)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  uv_cpu_info_t *cpu_infos_00;
  FILE *pFVar4;
  size_t sVar5;
  char *pcVar6;
  int *piVar7;
  uv_cpu_info_t *puVar8;
  uint unaff_EBP;
  ulong __nmemb;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  uint64_t user;
  uint local_474;
  uint *local_470;
  uv_cpu_info_t **local_468;
  uint64_t irq;
  uint64_t idle;
  uint64_t sys;
  uint64_t nice;
  uint64_t dummy;
  char buf [1024];
  
  *cpu_infos = (uv_cpu_info_t *)0x0;
  *count = 0;
  __stream = (FILE *)uv__open_file("/proc/stat");
  if (__stream == (FILE *)0x0) {
    piVar7 = __errno_location();
    return -*piVar7;
  }
  pcVar3 = fgets(buf,0x400,__stream);
  if (pcVar3 == (char *)0x0) {
    iVar13 = -5;
  }
  else {
    pcVar3 = fgets(buf,0x400,__stream);
    unaff_EBP = 0;
    if (pcVar3 != (char *)0x0) {
      do {
        if (buf[2] != 'u' || buf._0_2_ != 0x7063) break;
        unaff_EBP = unaff_EBP + 1;
        pcVar3 = fgets(buf,0x400,__stream);
      } while (pcVar3 != (char *)0x0);
    }
    iVar13 = (uint)(unaff_EBP != 0) * 5 + -5;
  }
  if (-1 < iVar13) {
    __nmemb = (ulong)unaff_EBP;
    local_468 = cpu_infos;
    cpu_infos_00 = (uv_cpu_info_t *)uv__calloc(__nmemb,0x38);
    if (cpu_infos_00 != (uv_cpu_info_t *)0x0) {
      pFVar4 = (FILE *)uv__open_file("/proc/cpuinfo");
      local_470 = (uint *)count;
      if (pFVar4 == (FILE *)0x0) {
        piVar7 = __errno_location();
        iVar13 = -*piVar7;
      }
      else {
        pcVar3 = fgets(buf,0x400,pFVar4);
        if (pcVar3 == (char *)0x0) {
          uVar12 = 0;
        }
        else {
          uVar11 = 0;
          uVar12 = 0;
          do {
            uVar11 = uVar11 & 0xffffffff;
            while ((__nmemb <= uVar12 ||
                   (CONCAT26(buf._11_2_,CONCAT33(buf._8_3_,buf._5_3_)) != 0x203a09656d616e20 ||
                    CONCAT44(buf._4_4_,CONCAT13(buf[3],CONCAT12(buf[2],buf._0_2_))) !=
                    0x616e206c65646f6d))) {
              uVar14 = uVar11;
              if ((uVar11 < __nmemb) &&
                 (CONCAT35(buf._8_3_,CONCAT41(buf._4_4_,buf[3])) == 0x203a09097a484d20 &&
                  CONCAT44(buf._4_4_,CONCAT13(buf[3],CONCAT12(buf[2],buf._0_2_))) ==
                  0x97a484d20757063)) {
                iVar13 = atoi(buf + 0xb);
                uVar14 = uVar11 + 1;
                cpu_infos_00[uVar11].speed = iVar13;
              }
              pcVar3 = fgets(buf,0x400,pFVar4);
              uVar11 = uVar14;
              if (pcVar3 == (char *)0x0) goto LAB_004dc850;
            }
            sVar5 = strlen(buf + 0xd);
            pcVar3 = uv__strndup(buf + 0xd,sVar5 - 1);
            if (pcVar3 == (char *)0x0) {
              fclose(pFVar4);
              goto LAB_004dc8bf;
            }
            uVar14 = uVar12 + 1;
            cpu_infos_00[uVar12].model = pcVar3;
            pcVar3 = fgets(buf,0x400,pFVar4);
            uVar12 = uVar14;
          } while (pcVar3 != (char *)0x0);
        }
LAB_004dc850:
        fclose(pFVar4);
        uVar9 = (uint)uVar12;
        if (uVar9 == 0) {
          pcVar3 = "unknown";
        }
        else {
          pcVar3 = cpu_infos_00[uVar9 - 1].model;
        }
        iVar13 = 0;
        if (uVar9 < unaff_EBP) {
          puVar8 = cpu_infos_00 + (uVar12 & 0xffffffff);
          lVar10 = __nmemb - (uVar12 & 0xffffffff);
          do {
            sVar5 = strlen(pcVar3);
            pcVar6 = uv__strndup(pcVar3,sVar5);
            if (pcVar6 == (char *)0x0) goto LAB_004dc8bf;
            puVar8->model = pcVar6;
            puVar8 = puVar8 + 1;
            lVar10 = lVar10 + -1;
          } while (lVar10 != 0);
        }
      }
      goto LAB_004dc8ca;
    }
    iVar13 = -0xc;
  }
LAB_004dcb42:
  iVar2 = fclose(__stream);
  if (iVar2 != 0) {
    piVar7 = __errno_location();
    if ((*piVar7 != 4) && (*piVar7 != 0x73)) {
LAB_004dcb74:
      abort();
    }
  }
  return iVar13;
LAB_004dc8bf:
  iVar13 = -0xc;
LAB_004dc8ca:
  if (iVar13 == 0) {
    lVar10 = sysconf(2);
    if (lVar10 == 0) {
      __assert_fail("clock_ticks != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                    ,0x2e1,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
    }
    if (lVar10 == -1) {
      __assert_fail("clock_ticks != (uint64_t) -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                    ,0x2e0,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
    }
    rewind(__stream);
    pcVar3 = fgets(buf,0x400,__stream);
    if (pcVar3 == (char *)0x0) goto LAB_004dcb74;
    pcVar3 = fgets(buf,0x400,__stream);
    uVar12 = 0;
    if ((unaff_EBP != 0) && (pcVar3 != (char *)0x0)) {
      uVar11 = 0;
      while (uVar12 = uVar11, buf[2] == 'u' && buf._0_2_ == 0x7063) {
        iVar13 = __isoc99_sscanf(buf,"cpu%u ",&local_474);
        if (iVar13 != 1) {
          __assert_fail("r == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                        ,0x2f5,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
        }
        pcVar3 = buf + 4;
        uVar9 = local_474;
        do {
          pcVar3 = pcVar3 + 1;
          bVar1 = 9 < uVar9;
          uVar9 = uVar9 / 10;
        } while (bVar1);
        iVar13 = __isoc99_sscanf(pcVar3,"%lu %lu %lu%lu %lu %lu",&user,&nice,&sys,&idle,&dummy,&irq)
        ;
        if (iVar13 != 6) goto LAB_004dcb74;
        uVar12 = uVar11 + 1;
        cpu_infos_00[uVar11].cpu_times.user = user * lVar10;
        cpu_infos_00[uVar11].cpu_times.nice = nice * lVar10;
        cpu_infos_00[uVar11].cpu_times.sys = sys * lVar10;
        cpu_infos_00[uVar11].cpu_times.idle = idle * lVar10;
        cpu_infos_00[uVar11].cpu_times.irq = irq * lVar10;
        pcVar3 = fgets(buf,0x400,__stream);
        if ((pcVar3 == (char *)0x0) || (uVar11 = uVar12, __nmemb <= uVar12)) break;
      }
    }
    if (uVar12 != __nmemb) {
      __assert_fail("num == numcpus",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                    ,0x312,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
    }
    iVar13 = 0;
  }
  if (iVar13 == 0) {
    if (unaff_EBP != 0 && cpu_infos_00->speed == 0) {
      piVar7 = &cpu_infos_00->speed;
      uVar12 = 0;
      do {
        snprintf(buf,0x400,"/sys/devices/system/cpu/cpu%u/cpufreq/scaling_cur_freq",
                 uVar12 & 0xffffffff);
        pFVar4 = (FILE *)uv__open_file(buf);
        iVar13 = 0;
        if (pFVar4 != (FILE *)0x0) {
          iVar13 = __isoc99_fscanf(pFVar4,"%lu",&user);
          if (iVar13 != 1) {
            user = 0;
          }
          fclose(pFVar4);
          iVar13 = (int)(user / 1000);
        }
        *piVar7 = iVar13;
        uVar12 = uVar12 + 1;
        piVar7 = piVar7 + 0xe;
      } while (__nmemb != uVar12);
    }
    *local_468 = cpu_infos_00;
    *local_470 = unaff_EBP;
    iVar13 = 0;
  }
  else {
    uv_free_cpu_info(cpu_infos_00,unaff_EBP);
  }
  goto LAB_004dcb42;
}

Assistant:

int uv_cpu_info(uv_cpu_info_t** cpu_infos, int* count) {
  unsigned int numcpus;
  uv_cpu_info_t* ci;
  int err;
  FILE* statfile_fp;

  *cpu_infos = NULL;
  *count = 0;

  statfile_fp = uv__open_file("/proc/stat");
  if (statfile_fp == NULL)
    return UV__ERR(errno);

  err = uv__cpu_num(statfile_fp, &numcpus);
  if (err < 0)
    goto out;

  err = UV_ENOMEM;
  ci = uv__calloc(numcpus, sizeof(*ci));
  if (ci == NULL)
    goto out;

  err = read_models(numcpus, ci);
  if (err == 0)
    err = read_times(statfile_fp, numcpus, ci);

  if (err) {
    uv_free_cpu_info(ci, numcpus);
    goto out;
  }

  /* read_models() on x86 also reads the CPU speed from /proc/cpuinfo.
   * We don't check for errors here. Worst case, the field is left zero.
   */
  if (ci[0].speed == 0)
    read_speeds(numcpus, ci);

  *cpu_infos = ci;
  *count = numcpus;
  err = 0;

out:

  if (fclose(statfile_fp))
    if (errno != EINTR && errno != EINPROGRESS)
      abort();

  return err;
}